

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<long,_11>::~TPZManVector(TPZManVector<long,_11> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}